

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void KokkosTools::SpaceTimeStack::kokkosp_end_deep_copy(void)

{
  State::end_deep_copy(global_state);
  return;
}

Assistant:

void kokkosp_end_deep_copy() { global_state->end_deep_copy(); }